

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

ll_node * cli_parse_args(int argc,char **argv,char *prefix)

{
  int iVar1;
  size_t sVar2;
  ll_node *plVar3;
  uint uVar4;
  uint uVar5;
  char *val;
  char *pcVar6;
  ulong uVar7;
  char **ppcVar8;
  char *local_58;
  ll_node *local_50;
  char **local_48;
  ll_node *local_40;
  ll_node *local_38;
  
  if (argc < 2 || argv == (char **)0x0) {
    local_38 = (ll_node *)0x0;
  }
  else {
    uVar4 = 1;
    local_38 = (ll_node *)0x0;
    local_40 = (ll_node *)0x0;
    local_48 = argv;
    do {
      if (((argv == (char **)0x0) || (prefix == (char *)0x0)) || ((int)uVar4 < 0)) {
        plVar3 = (ll_node *)0x0;
      }
      else {
        uVar7 = (ulong)uVar4;
        pcVar6 = argv[uVar7];
        iVar1 = starts_with(prefix,pcVar6);
        if (iVar1 == 0) {
          pcVar6 = (char *)0x0;
        }
        local_50 = (ll_node *)0x0;
        uVar5 = (uVar4 + 1) - (uint)(pcVar6 == (char *)0x0);
        uVar4 = uVar5;
        local_58 = pcVar6;
        if ((int)uVar5 < argc) {
          ppcVar8 = argv + ((uVar7 + 1) - (ulong)(pcVar6 == (char *)0x0));
          do {
            pcVar6 = *ppcVar8;
            iVar1 = starts_with(prefix,pcVar6);
            plVar3 = local_50;
            uVar4 = uVar5;
            if (iVar1 != 0) break;
            sVar2 = strlen(pcVar6);
            if (plVar3 == (ll_node *)0x0) {
              local_50 = ll_create_node(pcVar6,sVar2 + 1);
            }
            else {
              ll_append(plVar3,pcVar6,sVar2 + 1);
            }
            uVar5 = uVar5 + 1;
            ppcVar8 = ppcVar8 + 1;
            uVar4 = argc;
          } while ((int)uVar5 < argc);
        }
        plVar3 = ll_create_node(&local_58,0x10);
        argv = local_48;
      }
      if (plVar3 == (ll_node *)0x0) {
        return local_38;
      }
      if (local_38 == (ll_node *)0x0) {
        local_38 = plVar3;
      }
      if (local_40 != (ll_node *)0x0) {
        local_40->next = plVar3;
      }
      local_40 = plVar3;
    } while ((int)uVar4 < argc);
  }
  return local_38;
}

Assistant:

struct ll_node *cli_parse_args(int argc, const char *argv[], const char *prefix)
{
	int pos = 1;
	int end = pos;
	struct ll_node *root_node = NULL;
	struct ll_node *prev_node = NULL;
	struct ll_node *cur_node = NULL;

	if (argc <= 0 || argv == NULL) {
		return NULL;
	}
	while (pos < argc) {
		prev_node = cur_node;
		cur_node = parse_arg_range(pos, argc, &end, argv, prefix);
		if (cur_node == NULL) {
			break;
		}
		if (root_node == NULL) {
			root_node = cur_node;
		}
		if (prev_node != NULL) {
			prev_node->next = cur_node;
		}
		pos = end;
	}
	return root_node;
}